

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O2

void __thiscall RBTS<RemSP>::FirstScan(RBTS<RemSP> *this)

{
  CircularBuffer<int> *this_00;
  CircularBuffer<int> *this_01;
  uint uVar1;
  int iVar2;
  Mat1i *pMVar3;
  Mat1b *pMVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint i;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar19 = 0;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar1 = *(uint *)&pMVar4->field_0x8;
  iVar2 = *(int *)&pMVar4->field_0xc;
  this_00 = &this->s_queue_;
  this_01 = &this->e_queue_;
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar11 = uVar19;
  }
  do {
    if (uVar19 == uVar11) {
      return;
    }
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar12 = **(long **)&pMVar4->field_0x48 * uVar19 + *(long *)&pMVar4->field_0x10;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar16 = **(long **)&pMVar3->field_0x48;
    lVar15 = lVar16 * uVar19 + *(long *)&pMVar3->field_0x10;
    lVar16 = lVar15 - lVar16;
    iVar6 = iVar2 * (int)uVar19;
    for (iVar18 = 0; iVar18 < iVar2; iVar18 = iVar18 + 1) {
      lVar14 = (long)iVar18;
      if (*(char *)(lVar12 + lVar14) != '\0') {
        bVar21 = iVar18 != 0;
        iVar7 = CircularBuffer<int>::Enqueue(this_00,iVar18 + iVar6);
        iVar17 = iVar18;
        do {
          iVar9 = iVar17;
          lVar14 = lVar14 + 1;
          iVar17 = iVar2;
          iVar18 = iVar2 + -1;
          if (iVar2 <= lVar14) break;
          iVar17 = iVar9 + 1;
          iVar18 = iVar9;
        } while (*(char *)(lVar12 + lVar14) != '\0');
        iVar8 = CircularBuffer<int>::Enqueue(this_01,iVar18 + iVar6);
        iVar9 = (this->s_queue_).buffer_[(this->s_queue_).head_];
        iVar10 = (this->e_queue_).buffer_[(this->e_queue_).head_];
        while (uVar1 = RemSP::length_, iVar10 < (int)((-iVar2 - (uint)bVar21) + iVar7)) {
          iVar9 = CircularBuffer<int>::DequeueAndFront(this_00);
          iVar10 = CircularBuffer<int>::DequeueAndFront(this_01);
        }
        iVar20 = iVar8 - iVar2;
        iVar17 = (uint)(iVar17 != iVar2) + iVar20;
        if (iVar17 < iVar9) {
          RemSP::P_[RemSP::length_] = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
          for (uVar13 = (long)iVar7 % (long)iVar2 & 0xffffffff;
              uVar13 < (iVar8 - iVar7) + (int)((long)iVar7 % (long)iVar2) + 1; uVar13 = uVar13 + 1)
          {
            *(uint *)(lVar15 + uVar13 * 4) = uVar1;
          }
        }
        else {
          uVar1 = *(uint *)(lVar16 + (long)(iVar9 % iVar2) * 4);
          iVar5 = (int)((long)iVar7 % (long)iVar2);
          for (uVar13 = (long)iVar7 % (long)iVar2 & 0xffffffff; uVar13 < (iVar8 - iVar7) + iVar5 + 1
              ; uVar13 = uVar13 + 1) {
            *(uint *)(lVar15 + uVar13 * 4) = uVar1;
          }
          bVar21 = false;
          while (iVar10 <= iVar20) {
            if (bVar21) {
              RemSP::Merge(*(uint *)(lVar16 + (long)(iVar9 % iVar2) * 4),uVar1);
            }
            iVar9 = CircularBuffer<int>::DequeueAndFront(this_00);
            iVar10 = CircularBuffer<int>::DequeueAndFront(this_01);
            bVar21 = true;
          }
          while (iVar10 <= iVar20) {
            CircularBuffer<int>::Dequeue(this_00);
            CircularBuffer<int>::Dequeue(this_01);
            iVar9 = (this->s_queue_).buffer_[(this->s_queue_).head_];
            bVar21 = true;
            iVar10 = (this->e_queue_).buffer_[(this->e_queue_).head_];
          }
          if (!(bool)(~bVar21 | iVar17 < iVar9)) {
            RemSP::Merge(*(uint *)(lVar15 + (long)iVar5 * 4),
                         *(uint *)(lVar16 + (long)(iVar9 % iVar2) * 4));
          }
        }
      }
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue_.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue_.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue_.Front();
                int t = e_queue_.Front();
                while (t < s - w - clb) {
                    h = s_queue_.DequeueAndFront();
                    t = e_queue_.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue_.DequeueAndFront();
                        t = e_queue_.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue_.Dequeue();
                        e_queue_.Dequeue();
                        h = s_queue_.Front();
                        t = e_queue_.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for
        
    }